

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

cmValue __thiscall
cmGeneratorTarget::GetFilePrefixInternal
          (cmGeneratorTarget *this,string *config,ArtifactType artifact,string *language)

{
  cmMakefile *this_00;
  undefined8 __s;
  bool bVar1;
  TargetType TVar2;
  ulong uVar3;
  allocator<char> local_f1;
  string local_f0;
  string *local_d0;
  string *local_c8;
  undefined1 local_c0 [8];
  string langPrefix;
  char *prefixVar;
  string local_90;
  byte local_6d;
  byte local_5a;
  allocator<char> local_59;
  string local_58;
  byte local_31;
  string *psStack_30;
  bool isImportedLibraryArtifact;
  string *language_local;
  string *psStack_20;
  ArtifactType artifact_local;
  string *config_local;
  cmGeneratorTarget *this_local;
  cmValue targetPrefix;
  
  psStack_30 = language;
  language_local._4_4_ = artifact;
  psStack_20 = config;
  config_local = (string *)this;
  TVar2 = GetType(this);
  if ((((TVar2 == STATIC_LIBRARY) || (TVar2 = GetType(this), TVar2 == SHARED_LIBRARY)) ||
      (TVar2 = GetType(this), TVar2 == MODULE_LIBRARY)) ||
     (TVar2 = GetType(this), TVar2 == EXECUTABLE)) {
    local_31 = language_local._4_4_ == ImportLibraryArtifact;
    if ((!(bool)local_31) || (bVar1 = NeedImportLibraryName(this,psStack_20), bVar1)) {
      TVar2 = GetType(this);
      if (((TVar2 != SHARED_LIBRARY) && (TVar2 = GetType(this), TVar2 != MODULE_LIBRARY)) &&
         (TVar2 = GetType(this), TVar2 != EXECUTABLE)) {
        language_local._4_4_ = RuntimeBinaryArtifact;
      }
      local_5a = 0;
      local_6d = 0;
      prefixVar._6_1_ = 0;
      prefixVar._5_1_ = 0;
      if ((local_31 & 1) == 0) {
        std::allocator<char>::allocator();
        prefixVar._6_1_ = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_90,"PREFIX",(allocator<char> *)((long)&prefixVar + 7));
        prefixVar._5_1_ = 1;
        this_local = (cmGeneratorTarget *)GetProperty(this,&local_90);
      }
      else {
        std::allocator<char>::allocator();
        local_5a = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_58,"IMPORT_PREFIX",&local_59);
        local_6d = 1;
        this_local = (cmGeneratorTarget *)GetProperty(this,&local_58);
      }
      if ((prefixVar._5_1_ & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_90);
      }
      if ((prefixVar._6_1_ & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)((long)&prefixVar + 7));
      }
      if ((local_6d & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_58);
      }
      if ((local_5a & 1) != 0) {
        std::allocator<char>::~allocator(&local_59);
      }
      bVar1 = cmValue::operator_cast_to_bool((cmValue *)&this_local);
      if (!bVar1) {
        langPrefix.field_2._8_8_ =
             cmTarget::GetPrefixVariableInternal(this->Target,language_local._4_4_);
        uVar3 = std::__cxx11::string::empty();
        if (((uVar3 & 1) == 0) && (bVar1 = cmNonempty((char *)langPrefix.field_2._8_8_), bVar1)) {
          cmStrCat<char_const*&,char_const(&)[2],std::__cxx11::string_const&>
                    ((string *)local_c0,(char **)((long)&langPrefix.field_2 + 8),
                     (char (*) [2])0x1272de9,psStack_30);
          local_c8 = (string *)cmMakefile::GetDefinition(this->Makefile,(string *)local_c0);
          this_local = (cmGeneratorTarget *)local_c8;
          std::__cxx11::string::~string((string *)local_c0);
        }
        bVar1 = cmValue::operator_cast_to_bool((cmValue *)&this_local);
        __s = langPrefix.field_2._8_8_;
        if ((!bVar1) && (langPrefix.field_2._8_8_ != 0)) {
          this_00 = this->Makefile;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_f0,(char *)__s,&local_f1);
          local_d0 = (string *)cmMakefile::GetDefinition(this_00,&local_f0);
          this_local = (cmGeneratorTarget *)local_d0;
          std::__cxx11::string::~string((string *)&local_f0);
          std::allocator<char>::~allocator(&local_f1);
        }
      }
    }
    else {
      cmValue::cmValue((cmValue *)&this_local,(nullptr_t)0x0);
    }
  }
  else {
    cmValue::cmValue((cmValue *)&this_local,(nullptr_t)0x0);
  }
  return (cmValue)(string *)this_local;
}

Assistant:

cmValue cmGeneratorTarget::GetFilePrefixInternal(
  std::string const& config, cmStateEnums::ArtifactType artifact,
  const std::string& language) const
{
  // no prefix for non-main target types.
  if (this->GetType() != cmStateEnums::STATIC_LIBRARY &&
      this->GetType() != cmStateEnums::SHARED_LIBRARY &&
      this->GetType() != cmStateEnums::MODULE_LIBRARY &&
      this->GetType() != cmStateEnums::EXECUTABLE) {
    return nullptr;
  }

  const bool isImportedLibraryArtifact =
    (artifact == cmStateEnums::ImportLibraryArtifact);

  // Return an empty prefix for the import library if this platform
  // does not support import libraries.
  if (isImportedLibraryArtifact && !this->NeedImportLibraryName(config)) {
    return nullptr;
  }

  // The implib option is only allowed for shared libraries, module
  // libraries, and executables.
  if (this->GetType() != cmStateEnums::SHARED_LIBRARY &&
      this->GetType() != cmStateEnums::MODULE_LIBRARY &&
      this->GetType() != cmStateEnums::EXECUTABLE) {
    artifact = cmStateEnums::RuntimeBinaryArtifact;
  }

  // Compute prefix value.
  cmValue targetPrefix =
    (isImportedLibraryArtifact ? this->GetProperty("IMPORT_PREFIX")
                               : this->GetProperty("PREFIX"));

  if (!targetPrefix) {
    const char* prefixVar = this->Target->GetPrefixVariableInternal(artifact);
    if (!language.empty() && cmNonempty(prefixVar)) {
      std::string langPrefix = cmStrCat(prefixVar, "_", language);
      targetPrefix = this->Makefile->GetDefinition(langPrefix);
    }

    // if there is no prefix on the target nor specific language
    // use the cmake definition.
    if (!targetPrefix && prefixVar) {
      targetPrefix = this->Makefile->GetDefinition(prefixVar);
    }
  }

  return targetPrefix;
}